

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

void __thiscall Bstrlib::String::String(String *this)

{
  uchar *puVar1;
  String *this_local;
  
  (this->super_tagbstring).slen = 0;
  (this->super_tagbstring).mlen = 8;
  puVar1 = (uchar *)malloc((long)(this->super_tagbstring).mlen);
  (this->super_tagbstring).data = puVar1;
  if ((this->super_tagbstring).data == (uchar *)0x0) {
    (this->super_tagbstring).mlen = 0;
    fprintf(_stderr,"[FATAL ERROR] %s:%d => %s",
            "/workspace/llm4binary/github/license_c_cmakelists/X-Ryl669[P]eMQTT5/tests/ClassPath/src/bstrwrap.cpp"
            ,0x29,"Failure in default constructor");
  }
  else {
    *(this->super_tagbstring).data = '\0';
  }
  return;
}

Assistant:

String::String()
    {
        slen = 0; mlen = 8;
        data = (unsigned char*)malloc(mlen);
        if (!data)
        {
            mlen = 0;
            bstringThrow("Failure in default constructor");
        }
        else data[0] = '\0';
    }